

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O1

lafe_line_reader * lafe_line_reader(char *pathname,int nullSeparator)

{
  int iVar1;
  lafe_line_reader *plVar2;
  char *pcVar3;
  FILE *pFVar4;
  int *piVar5;
  
  plVar2 = (lafe_line_reader *)calloc(1,0x48);
  if (plVar2 == (lafe_line_reader *)0x0) {
    pcVar3 = "Can\'t open %s";
    iVar1 = 0xc;
  }
  else {
    plVar2->nullSeparator = nullSeparator;
    pcVar3 = strdup(pathname);
    plVar2->pathname = pcVar3;
    iVar1 = strcmp(pathname,"-");
    pFVar4 = _stdin;
    if (iVar1 != 0) {
      pFVar4 = fopen(pathname,"r");
    }
    plVar2->f = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      plVar2->buff_length = 0x2000;
      plVar2->buff = (char *)0x0;
      plVar2->buff_end = (char *)0x0;
      plVar2->line_start = (char *)0x0;
      plVar2->line_end = (char *)0x0;
      return plVar2;
    }
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    pcVar3 = "Couldn\'t open %s";
  }
  lafe_errc(1,iVar1,pcVar3,pathname);
}

Assistant:

struct lafe_line_reader *
lafe_line_reader(const char *pathname, int nullSeparator)
{
	struct lafe_line_reader *lr;

	lr = calloc(1, sizeof(*lr));
	if (lr == NULL)
		lafe_errc(1, ENOMEM, "Can't open %s", pathname);

	lr->nullSeparator = nullSeparator;
	lr->pathname = strdup(pathname);

	if (strcmp(pathname, "-") == 0)
		lr->f = stdin;
	else
		lr->f = fopen(pathname, "r");
	if (lr->f == NULL)
		lafe_errc(1, errno, "Couldn't open %s", pathname);
	lr->buff_length = 8192;
	lr->line_start = lr->line_end = lr->buff_end = lr->buff = NULL;

	return (lr);
}